

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

bool GetControl<unsigned_int>(Services *OS,char *name,uint *value)

{
  bool bVar1;
  undefined1 uVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  uint readValue;
  allocator local_4d;
  uint local_4c;
  string local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  local_4c = 0;
  std::__cxx11::string::string((string *)&local_48,name,&local_4d);
  bVar1 = ::OS::Services_Common::GetControl(&OS->super_Services_Common,&local_48,&local_4c,4);
  paVar3 = &local_48.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar3) {
    operator_delete(local_48._M_dataplus._M_p);
    paVar3 = extraout_RAX;
  }
  uVar2 = SUB81(paVar3,0);
  if (bVar1) {
    uVar2 = (undefined1)local_4c;
    *value = local_4c;
  }
  return (bool)uVar2;
}

Assistant:

static bool GetControl(
    const OS::Services& OS,
    const char* name,
    T& value )
{
    unsigned int    readValue = 0;
    bool success = OS.GetControl( name, &readValue, sizeof(readValue) );
    if( success )
    {
        value = readValue;
    }

    return success;
}